

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

void __thiscall
Imath_3_1::Matrix44<float>::Matrix44
          (Matrix44<float> *this,float a,float b,float c,float d,float e,float f,float g,float h,
          float i,float j,float k,float l,float m,float n,float o,float p)

{
  float h_local;
  float g_local;
  float f_local;
  float e_local;
  float d_local;
  float c_local;
  float b_local;
  float a_local;
  Matrix44<float> *this_local;
  
  this->x[0][0] = a;
  this->x[0][1] = b;
  this->x[0][2] = c;
  this->x[0][3] = d;
  this->x[1][0] = e;
  this->x[1][1] = f;
  this->x[1][2] = g;
  this->x[1][3] = h;
  this->x[2][0] = i;
  this->x[2][1] = j;
  this->x[2][2] = k;
  this->x[2][3] = l;
  this->x[3][0] = m;
  this->x[3][1] = n;
  this->x[3][2] = o;
  this->x[3][3] = p;
  return;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Matrix44<
    T>::Matrix44 (T a, T b, T c, T d, T e, T f, T g, T h, T i, T j, T k, T l, T m, T n, T o, T p) IMATH_NOEXCEPT
{
    x[0][0] = a;
    x[0][1] = b;
    x[0][2] = c;
    x[0][3] = d;
    x[1][0] = e;
    x[1][1] = f;
    x[1][2] = g;
    x[1][3] = h;
    x[2][0] = i;
    x[2][1] = j;
    x[2][2] = k;
    x[2][3] = l;
    x[3][0] = m;
    x[3][1] = n;
    x[3][2] = o;
    x[3][3] = p;
}